

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::serialize_w_v_b(Model *this,FILE *file)

{
  int iVar1;
  char *in_RDI;
  size_t in_stack_00000270;
  char *in_stack_00000278;
  FILE *in_stack_00000280;
  
  WriteDataToDisk(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 != 0) {
    WriteDataToDisk(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  }
  WriteDataToDisk(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  WriteDataToDisk(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 != 0) {
    WriteDataToDisk(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  }
  return;
}

Assistant:

void Model::serialize_w_v_b(FILE* file) {
  // Write size of w
  WriteDataToDisk(file, (char*)&param_num_w_, sizeof(param_num_w_));
  // Write size of v
  if (score_func_.compare("linear") != 0) {
    WriteDataToDisk(file, (char*)&param_num_v_, sizeof(param_num_v_));
  }
  // Write w
  WriteDataToDisk(file, (char*)param_w_, sizeof(real_t)*param_num_w_);
  // Write b
  WriteDataToDisk(file, (char*)param_b_, sizeof(real_t)*aux_size_);
  // Write v
  if (score_func_.compare("linear") != 0) {
    WriteDataToDisk(file, (char*)param_v_, sizeof(real_t)*param_num_v_);
  }
}